

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall smf::Binasc::outputStyleMidi(Binasc *this,ostream *out,istream *input)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  long *plVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  uchar ch;
  uchar byte2;
  uchar byte1;
  int command;
  int trackbytes;
  stringstream tempout;
  byte local_20f;
  undefined1 local_20e;
  char local_20d;
  uint local_20c;
  Binasc *local_208;
  ulong local_200;
  int local_1f8;
  int local_1f4;
  ulong local_1f0;
  uint local_1e8;
  undefined4 uStack_1e4;
  long local_1e0;
  undefined1 local_1d8 [16];
  long local_1c8;
  ostream *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_208 = this;
  local_1c0 = out;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::istream::read((char *)input,(long)&local_20f);
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    lVar12 = 0x11;
    if (local_20f == 0x4d) {
      std::istream::read((char *)input,(long)&local_20f);
      if (local_20f == 0x54) {
        std::istream::read((char *)input,(long)&local_20f);
        if (local_20f == 0x68) {
          std::istream::read((char *)input,(long)&local_20f);
          if (local_20f == 100) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"MThd\"",6);
            if (local_208->m_commentsQ != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\t\t\t; MIDI header chunk marker",0x1d);
            }
            cVar1 = (char)(ostream *)local_1a8;
            std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
            std::ostream::put(cVar1);
            std::ostream::flush();
            std::istream::read((char *)input,(long)&local_20f);
            bVar2 = local_20f;
            std::istream::read((char *)input,(long)&local_20f);
            bVar3 = local_20f;
            std::istream::read((char *)input,(long)&local_20f);
            local_20c = (uint)local_20f;
            std::istream::read((char *)input,(long)&local_20f);
            local_1f0 = (ulong)local_20f;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"4\'",2);
            local_1c8 = (ulong)bVar3 << 8;
            iVar13 = ((int)local_1c8 + (uint)bVar2 * 0x10000 + local_20c) * 0x100 + (int)local_1f0;
            std::ostream::operator<<((ostream *)local_1a8,iVar13);
            if (local_208->m_commentsQ != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\t\t\t; bytes to follow in header chunk",0x24);
            }
            std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
            std::ostream::put((char)local_1a8);
            std::ostream::flush();
            std::istream::read((char *)input,(long)&local_20f);
            bVar3 = local_20f;
            std::istream::read((char *)input,(long)&local_20f);
            bVar4 = local_20f;
            uVar15 = (ulong)local_20f;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"2\'",2);
            uVar10 = (uint)CONCAT11(bVar3,bVar4);
            std::ostream::operator<<((ostream *)local_1a8,uVar10);
            if (local_208->m_commentsQ != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\t\t\t; file format: Type-",0x17);
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
              if (uVar10 < 3) {
                pcVar14 = &DAT_001263bc + *(int *)(&DAT_001263bc + uVar15 * 4);
                lVar12 = *(long *)(&DAT_001263c8 + uVar15 * 8);
              }
              else {
                lVar12 = 7;
                pcVar14 = "unknown";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar14,lVar12);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
            }
            std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
            std::ostream::put((char)local_1a8);
            std::ostream::flush();
            std::istream::read((char *)input,(long)&local_20f);
            bVar3 = local_20f;
            std::istream::read((char *)input,(long)&local_20f);
            bVar4 = local_20f;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"2\'",2);
            local_200 = (ulong)bVar3 << 8;
            local_1f8 = (int)local_200 + (uint)bVar4;
            std::ostream::operator<<((ostream *)local_1a8,local_1f8);
            if (local_208->m_commentsQ != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\t\t\t; number of tracks",0x15);
            }
            std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
            std::ostream::put((char)local_1a8);
            std::ostream::flush();
            std::istream::read((char *)input,(long)&local_20d);
            std::istream::read((char *)input,(long)&local_20e);
            if (local_20d < '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'-",2);
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              if (local_208->m_commentsQ != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"\t\t\t; SMPTE frames/second",0x18);
              }
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
              std::ostream::_M_insert<long>((long)local_1a8);
              if (local_208->m_commentsQ != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"\t\t\t; subframes per frame",0x18);
              }
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"2\'",2);
              std::ostream::operator<<((ostream *)local_1a8,(int)CONCAT11(local_20d,local_20e));
              if (local_208->m_commentsQ != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"\t\t\t; ticks per quarter note",0x1b);
              }
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            }
            if (6 < iVar13) {
              iVar7 = (int)local_1f0 + ((uint)bVar2 * 0x10000 + (int)local_1c8 + local_20c) * 0x100
                      + -6;
              iVar11 = 1;
              if (1 < iVar7) {
                iVar11 = iVar7;
              }
              iVar11 = -iVar11;
              do {
                std::istream::read((char *)input,(long)&local_20f);
                if (local_20f < 0x10) {
                  local_1e8 = CONCAT31(local_1e8._1_3_,0x30);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)&local_1e8,1);
                }
                *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                     *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8
                ;
                std::ostream::operator<<((ostream *)local_1a8,(uint)local_20f);
                iVar11 = iVar11 + 1;
              } while (iVar11 != 0);
              if (6 < iVar13) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"\t\t\t; unknown header bytes",0x19);
                std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
              }
            }
            if (local_1f8 != 0) {
              local_200 = (ulong)((uint)local_200 | (uint)bVar4);
              local_20c = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"\n;;; TRACK ",0xb);
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_20c);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8," ----------------------------------",0x23);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                std::ostream::put((char)poVar8);
                std::ostream::flush();
                std::istream::read((char *)input,(long)&local_20f);
                lVar12 = 0x12;
                if (local_20f != 0x4d) {
                  pcVar14 = "Not a MIDI file M2";
LAB_00114188:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar14,lVar12);
                  iVar13 = 0;
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                  goto LAB_00113ad5;
                }
                std::istream::read((char *)input,(long)&local_20f);
                if (local_20f != 0x54) {
                  pcVar14 = "Not a MIDI file T2";
                  goto LAB_00114188;
                }
                std::istream::read((char *)input,(long)&local_20f);
                lVar12 = 0x11;
                if (local_20f != 0x72) {
                  pcVar14 = "Not a MIDI file r";
                  goto LAB_00114188;
                }
                std::istream::read((char *)input,(long)&local_20f);
                if (local_20f != 0x6b) {
                  pcVar14 = "Not a MIDI file k";
                  goto LAB_00114188;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"\"MTrk\"",6);
                if (local_208->m_commentsQ != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"\t\t\t; MIDI track chunk marker",0x1c);
                }
                cVar1 = (char)(ostream *)local_1a8;
                std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
                std::ostream::put(cVar1);
                std::ostream::flush();
                std::istream::read((char *)input,(long)&local_20f);
                bVar2 = local_20f;
                std::istream::read((char *)input,(long)&local_20f);
                bVar3 = local_20f;
                std::istream::read((char *)input,(long)&local_20f);
                bVar4 = local_20f;
                std::istream::read((char *)input,(long)&local_20f);
                bVar5 = local_20f;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"4\'",2);
                uVar10 = ((uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar4) << 8 | (uint)bVar5;
                std::ostream::operator<<((ostream *)local_1a8,uVar10);
                if (local_208->m_commentsQ != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"\t\t\t; bytes to follow in track chunk",0x23);
                }
                std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
                std::ostream::put((char)local_1a8);
                std::ostream::flush();
                local_1e8 = 0;
                local_1f4 = 0;
                while( true ) {
                  iVar13 = readMidiEvent(local_208,(ostream *)local_1a8,input,(int *)&local_1e8,
                                         &local_1f4);
                  if (iVar13 == 0) break;
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                uVar6 = local_1e8;
                if (local_1e8 != uVar10) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"; TRACK SIZE ERROR, ACTUAL SIZE: ",0x21);
                  plVar9 = (long *)std::ostream::operator<<((ostream *)local_1a8,uVar6);
                  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
                  std::ostream::put((char)plVar9);
                  std::ostream::flush();
                }
                local_20c = local_20c + 1;
              } while (local_20c != (uint)local_200);
            }
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1c0,(char *)CONCAT44(uStack_1e4,local_1e8),local_1e0);
            if ((undefined1 *)CONCAT44(uStack_1e4,local_1e8) != local_1d8) {
              operator_delete((undefined1 *)CONCAT44(uStack_1e4,local_1e8));
            }
            iVar13 = 1;
            goto LAB_00113ad5;
          }
          pcVar14 = "Not a MIDI file d";
        }
        else {
          pcVar14 = "Not a MIDI file h";
        }
      }
      else {
        pcVar14 = "Not a MIDI file T";
      }
    }
    else {
      pcVar14 = "Not a MIDI file M";
    }
  }
  else {
    lVar12 = 0x1b;
    pcVar14 = "End of the file right away!";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,lVar12);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
  std::ostream::put(-0x10);
  iVar13 = 0;
  std::ostream::flush();
LAB_00113ad5:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return iVar13;
}

Assistant:

int Binasc::outputStyleMidi(std::ostream& out, std::istream& input) {
	uchar ch;                      // current input byte
	std::stringstream tempout;
	input.read((char*)&ch, 1);

	if (input.eof()) {
		std::cerr << "End of the file right away!" << std::endl;
		return 0;
	}

	// Read the MIDI file header:

	// The first four bytes must be the characters "MThd"
	if (ch != 'M') { std::cerr << "Not a MIDI file M" << std::endl; return 0; }
	input.read((char*)&ch, 1);
	if (ch != 'T') { std::cerr << "Not a MIDI file T" << std::endl; return 0; }
	input.read((char*)&ch, 1);
	if (ch != 'h') { std::cerr << "Not a MIDI file h" << std::endl; return 0; }
	input.read((char*)&ch, 1);
	if (ch != 'd') { std::cerr << "Not a MIDI file d" << std::endl; return 0; }
	tempout << "\"MThd\"";
	if (m_commentsQ) {
		tempout << "\t\t\t; MIDI header chunk marker";
	}
	tempout << std::endl;

	// The next four bytes are a big-endian byte count for the header
	// which should nearly always be "6".
	int headersize = 0;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	input.read((char*)&ch, 1); headersize = (headersize << 8) | ch;
	tempout << "4'" << headersize;
	if (m_commentsQ) {
		tempout << "\t\t\t; bytes to follow in header chunk";
	}
	tempout << std::endl;

	// First number in header is two-byte file type.
	int filetype = 0;
	input.read((char*)&ch, 1);
	filetype = (filetype << 8) | ch;
	input.read((char*)&ch, 1);
	filetype = (filetype << 8) | ch;
	tempout << "2'" << filetype;
	if (m_commentsQ) {
		tempout << "\t\t\t; file format: Type-" << filetype << " (";
		switch (filetype) {
			case 0:  tempout << "single track"; break;
			case 1:  tempout << "multitrack";   break;
			case 2:  tempout << "multisegment"; break;
			default: tempout << "unknown";      break;
		}
		tempout << ")";
	}
	tempout << std::endl;

	// Second number in header is two-byte trackcount.
	int trackcount = 0;
	input.read((char*)&ch, 1);
	trackcount = (trackcount << 8) | ch;
	input.read((char*)&ch, 1);
	trackcount = (trackcount << 8) | ch;
	tempout << "2'" << trackcount;
	if (m_commentsQ) {
		tempout << "\t\t\t; number of tracks";
	}
	tempout << std::endl;

	// Third number is divisions.  This can be one of two types:
	// regular: top bit is 0: number of ticks per quarter note
	// SMPTE:   top bit is 1: first byte is negative frames, second is
	//          ticks per frame.
	uchar byte1;
	uchar byte2;
	input.read((char*)&byte1, 1);
	input.read((char*)&byte2, 1);
	if (byte1 & 0x80) {
		// SMPTE divisions
		tempout << "'-" << 0xff - (ulong)byte1 + 1;
		if (m_commentsQ) {
			tempout << "\t\t\t; SMPTE frames/second";
		}
		tempout << std::endl;
		tempout << "'" << std::dec << (long)byte2;
		if (m_commentsQ) {
			tempout << "\t\t\t; subframes per frame";
		}
		tempout << std::endl;
	} else {
		// regular divisions
		int divisions = 0;
		divisions = (divisions << 8) | byte1;
		divisions = (divisions << 8) | byte2;
		tempout << "2'" << divisions;
		if (m_commentsQ) {
			tempout << "\t\t\t; ticks per quarter note";
		}
		tempout << std::endl;
	}

	// Print any strange bytes in header:
	int i;
	for (i=0; i<headersize - 6; i++) {
		input.read((char*)&ch, 1);
		if (ch < 0x10) {
			tempout << '0';
		}
		tempout << std::hex << (int)ch;
	}
	if (headersize - 6 > 0) {
		tempout << "\t\t\t; unknown header bytes";
		tempout << std::endl;
	}

	for (i=0; i<trackcount; i++) {
		tempout << "\n;;; TRACK "
				  << i << " ----------------------------------" << std::endl;

		input.read((char*)&ch, 1);
		// The first four bytes of a track must be the characters "MTrk"
		if (ch != 'M') { std::cerr << "Not a MIDI file M2" << std::endl; return 0; }
		input.read((char*)&ch, 1);
		if (ch != 'T') { std::cerr << "Not a MIDI file T2" << std::endl; return 0; }
		input.read((char*)&ch, 1);
		if (ch != 'r') { std::cerr << "Not a MIDI file r" << std::endl; return 0; }
		input.read((char*)&ch, 1);
		if (ch != 'k') { std::cerr << "Not a MIDI file k" << std::endl; return 0; }
		tempout << "\"MTrk\"";
		if (m_commentsQ) {
			tempout << "\t\t\t; MIDI track chunk marker";
		}
		tempout << std::endl;

		// The next four bytes are a big-endian byte count for the track
		int tracksize = 0;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		input.read((char*)&ch, 1); tracksize = (tracksize << 8) | ch;
		tempout << "4'" << tracksize;
		if (m_commentsQ) {
			tempout << "\t\t\t; bytes to follow in track chunk";
		}
		tempout << std::endl;

		int trackbytes = 0;
		int command = 0;

		// process MIDI events until the end of the track
		while (readMidiEvent(tempout, input, trackbytes, command)) {
			tempout << "\n";
		};
		tempout << "\n";

		if (trackbytes != tracksize) {
			tempout << "; TRACK SIZE ERROR, ACTUAL SIZE: " << trackbytes << std::endl;
		}
	}

	// print #define definitions if requested.


	// print main content of MIDI file parsing:
	out << tempout.str();
	return 1;
}